

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdmsgs.cc
# Opt level: O3

be_node * makeCompactPeerIds(list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *values)

{
  be_node *list;
  be_node *node;
  _List_node_base *p_Var1;
  
  list = be_create_list();
  for (p_Var1 = (values->
                super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl._M_node.super__List_node_base._M_next; p_Var1 != (_List_node_base *)values
      ; p_Var1 = (((_List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&p_Var1->_M_next)->_M_impl)._M_node.super__List_node_base._M_next) {
    node = be_create_str_wlen((char *)p_Var1[1]._M_next,*(int *)&p_Var1[1]._M_prev);
    be_add_list(list,node);
  }
  return list;
}

Assistant:

be_node *makeCompactPeerIds(std::list<std::string> &values) {
        be_node *valuesnode = be_create_list();
	std::list<std::string>::iterator it;
	for (it = values.begin(); it != values.end(); it++) {
        	be_node *val1 = be_create_str_wlen((char *) it->c_str(), it->length());
		be_add_list(valuesnode, val1);
	}
	return valuesnode;
}